

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvec.c
# Opt level: O1

size_t bitvec_count_set(bitvec_t *vec,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  bitvec_t *pbVar4;
  long lVar5;
  
  uVar2 = (ulong)((uint)len & 0x1f);
  if (len < 0x20) {
    sVar1 = 0;
  }
  else {
    sVar1 = 0;
    uVar3 = 0;
    pbVar4 = vec;
    do {
      if (*pbVar4 != 0) {
        lVar5 = 0;
        do {
          sVar1 = sVar1 + ((*pbVar4 >> ((uint)lVar5 & 0x1f) & 1) != 0);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
      }
      uVar3 = uVar3 + 1;
      pbVar4 = pbVar4 + 1;
    } while (uVar3 != len >> 5);
    vec = vec + (len >> 5);
  }
  if (uVar2 != 0) {
    uVar3 = 0;
    do {
      sVar1 = sVar1 + ((*vec >> ((uint)uVar3 & 0x1f) & 1) != 0);
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
  }
  return sVar1;
}

Assistant:

size_t
bitvec_count_set(bitvec_t *vec, size_t len)
{
    size_t words, bits, w, b, n;
    bitvec_t *v;

    words = len / BITVEC_BITS;
    bits = len % BITVEC_BITS;
    v = vec;
    n = 0;
    for (w = 0; w < words; ++w, ++v) {
        if (*v == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b)
            if (*v & (1<<b))
                ++n;
    }
    for (b = 0; b < bits; ++b)
        if (*v & (1<<b))
            ++n;

    return n;
}